

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_pcg_serial.c
# Opt level: O1

int PSolve(void *Data,N_Vector r_vec,N_Vector z_vec,sunrealtype tol,int lr)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  lVar3 = N_VGetArrayPointer(r_vec);
  if ((((lVar3 == 0) || (lVar4 = N_VGetArrayPointer(z_vec), lVar4 == 0)) ||
      (lVar5 = N_VGetArrayPointer(*(undefined8 *)((long)Data + 8)), lVar5 == 0)) ||
     (lVar6 = N_VGetArrayPointer(*(undefined8 *)((long)Data + 0x10)), lVar6 == 0)) {
    PSolve_cold_1();
    iVar7 = 1;
  }
  else {
    lVar2 = *Data;
    iVar7 = 0;
    if (0 < lVar2) {
      lVar8 = 0;
      do {
        dVar1 = *(double *)(lVar6 + lVar8 * 8);
        *(double *)(lVar4 + lVar8 * 8) =
             (dVar1 * dVar1 * *(double *)(lVar3 + lVar8 * 8)) / *(double *)(lVar5 + lVar8 * 8);
        lVar8 = lVar8 + 1;
        iVar7 = 0;
      } while (lVar2 != lVar8);
    }
  }
  return iVar7;
}

Assistant:

int PSolve(void* Data, N_Vector r_vec, N_Vector z_vec, sunrealtype tol, int lr)
{
  /* local variables */
  sunrealtype *r, *z, *d, *s;
  sunindextype i;
  UserData* ProbData;

  /* access user data structure and vector data */
  ProbData = (UserData*)Data;
  r        = N_VGetArrayPointer(r_vec);
  if (check_flag(r, "N_VGetArrayPointer", 0)) { return 1; }
  z = N_VGetArrayPointer(z_vec);
  if (check_flag(z, "N_VGetArrayPointer", 0)) { return 1; }
  d = N_VGetArrayPointer(ProbData->d);
  if (check_flag(d, "N_VGetArrayPointer", 0)) { return 1; }
  s = N_VGetArrayPointer(ProbData->s);
  if (check_flag(s, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate through domain, performing Jacobi solve */
  for (i = 0; i < ProbData->N; i++) { z[i] = s[i] * s[i] * r[i] / d[i]; }

  /* return with success */
  return 0;
}